

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O3

void __thiscall Assimp::MDLImporter::~MDLImporter(MDLImporter *this)

{
  ~MDLImporter(this);
  operator_delete(this,0xd0);
  return;
}

Assistant:

MDLImporter::~MDLImporter() {
    // empty
}